

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_pax.c
# Opt level: O1

void test_acl_pax(void)

{
  longlong v1;
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive *paVar4;
  FILE *__s;
  size_t v2;
  char *_v2;
  size_t used;
  archive_entry *ae;
  size_t reference_size;
  uint local_48;
  undefined4 uStack_44;
  archive_entry *local_40;
  size_t local_38;
  
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'¹',(uint)(paVar4 != (archive *)0x0),"NULL != (a = archive_write_new())",
                   (void *)0x0);
  iVar1 = archive_write_set_format_pax(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'º',(uint)(iVar1 == 0),"0 == archive_write_set_format_pax(a)",paVar4);
  iVar1 = archive_write_add_filter_none(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'»',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar4);
  iVar1 = archive_write_set_bytes_per_block(paVar4,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'¼',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 1)",paVar4);
  iVar1 = archive_write_set_bytes_in_last_block(paVar4,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'½',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 1)",
                   paVar4);
  iVar1 = archive_write_open_memory(paVar4,buff,0x4000,(size_t *)&local_48);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'¾',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar4);
  local_40 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ã',(uint)(local_40 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_pathname(local_40,"file");
  archive_entry_set_mode(local_40,0x81ff);
  set_acls(local_40,acls0,3);
  iVar1 = archive_write_header(paVar4,local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'É',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar4);
  set_acls(local_40,acls1,4);
  iVar1 = archive_write_header(paVar4,local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Í',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar4);
  set_acls(local_40,acls2,6);
  iVar1 = archive_write_header(paVar4,local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ò',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar4);
  set_acls(local_40,acls0,3);
  iVar1 = archive_write_header(paVar4,local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ù',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar4);
  archive_entry_free(local_40);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ý',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Þ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  __s = fopen("testout","wb");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'á',(uint)(__s != (FILE *)0x0),"NULL != (f = fopen(\"testout\", \"wb\"))",
                   (void *)0x0);
  v1 = CONCAT44(uStack_44,local_48);
  v2 = fwrite(buff,1,(ulong)local_48,__s);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'â',v1,"used",v2,"(size_t)fwrite(buff, 1, (unsigned int)used, f)",
                      (void *)0x0);
  fclose(__s);
  extract_reference_file("test_acl_pax.tar");
  _v2 = slurpfile(&local_38,"test_acl_pax.tar");
  failure(
         "Generated pax archive does not match reference; compare \'testout\' to \'test_acl_pax.tar\' reference file."
         );
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'ë',buff,"buff",_v2,"reference",local_38,"reference_size",(void *)0x0);
  failure(
         "Generated pax archive does not match reference; compare \'testout\' to \'test_acl_pax.tar\' reference file."
         );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'í',(long)(int)local_48,"(int)used",local_38,"reference_size",(void *)0x0);
  free(_v2);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ñ',(uint)(paVar4 != (archive *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ò',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ó',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_open_memory(paVar4,buff,CONCAT44(uStack_44,local_48));
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ô',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff, used)",paVar4);
  iVar1 = archive_read_next_header(paVar4,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'÷',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar4);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  wVar2 = archive_entry_acl_reset(local_40,L'Ā');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ù',(uint)(wVar2 == L'\0'),
                   "0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  mVar3 = archive_entry_mode(local_40);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ü',(uint)((mVar3 & 0x1ff) == 0x62),"(archive_entry_mode(ae) & 0777) == 0142",
                   (void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ÿ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar4);
  failure("One extended ACL should flag all ACLs to be returned.");
  wVar2 = archive_entry_acl_reset(local_40,L'Ā');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ā',(uint)(wVar2 == L'\x04'),
                   "4 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  compare_acls(local_40,acls1,4,0x62);
  mVar3 = archive_entry_mode(local_40);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ą',(uint)((mVar3 & 0x1ff) == 0x62),"(archive_entry_mode(ae) & 0777) == 0142",
                   (void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ĉ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar4);
  wVar2 = archive_entry_acl_reset(local_40,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'ĉ',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  compare_acls(local_40,acls2,6,0x163);
  mVar3 = archive_entry_mode(local_40);
  failure("Basic ACLs should set mode to 0543, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'č',(uint)((mVar3 & 0x1ff) == 0x163),"(archive_entry_mode(ae) & 0777) == 0543"
                   ,(void *)0x0);
  iVar1 = archive_read_next_header(paVar4,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Đ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar4);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  wVar2 = archive_entry_acl_reset(local_40,L'Ā');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ē',(uint)(wVar2 == L'\0'),
                   "0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  mVar3 = archive_entry_mode(local_40);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ĕ',(uint)((mVar3 & 0x1ff) == 0x62),"(archive_entry_mode(ae) & 0777) == 0142",
                   (void *)0x0);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ę',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'ę',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_acl_pax)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t used;
	FILE *f;
	void *reference;
	size_t reference_size;

	/* Write an archive to memory. */
	assert(NULL != (a = archive_write_new()));
	assertA(0 == archive_write_set_format_pax(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Write a series of files to the archive with different ACL info. */

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "file");
        archive_entry_set_mode(ae, S_IFREG | 0777);

	/* Basic owner/owning group should just update mode bits. */
	set_acls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]));
	assertA(0 == archive_write_header(a, ae));

	/* With any extended ACL entry, we should read back a full set. */
	set_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));
	assertA(0 == archive_write_header(a, ae));


	/* A more extensive set of ACLs. */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	assertA(0 == archive_write_header(a, ae));

	/*
	 * Check that clearing ACLs gets rid of them all by repeating
	 * the first test.
	 */
	set_acls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]));
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Write out the data we generated to a file for manual inspection. */
	assert(NULL != (f = fopen("testout", "wb")));
	assertEqualInt(used, (size_t)fwrite(buff, 1, (unsigned int)used, f));
	fclose(f);

	/* Write out the reference data to a file for manual inspection. */
	extract_reference_file("test_acl_pax.tar");
	reference = slurpfile(&reference_size, "test_acl_pax.tar");

	/* Assert that the generated data matches the built-in reference data.*/
	failure("Generated pax archive does not match reference; compare 'testout' to 'test_acl_pax.tar' reference file.");
	assertEqualMem(buff, reference, reference_size);
	failure("Generated pax archive does not match reference; compare 'testout' to 'test_acl_pax.tar' reference file.");
	assertEqualInt((int)used, reference_size);
	free(reference);

	/* Read back each entry and check that the ACL data is right. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, used));

	/* First item has no ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assert(0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/* Second item has a few ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("One extended ACL should flag all ACLs to be returned.");
	assert(4 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	compare_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]), 0142);
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/* Third item has pretty extensive ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	compare_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]), 0543);
	failure("Basic ACLs should set mode to 0543, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0543);

	/* Fourth item has no ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assert(0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}